

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O1

void duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_long>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  idx_t count;
  uint64_t *puVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  allocate_function_ptr_t p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  hugeint_t *ldata;
  byte bVar7;
  bool bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  SelectionVector *pSVar10;
  reference pvVar11;
  VectorBuffer *pVVar12;
  ulong uVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  idx_t iVar16;
  hugeint_t hVar17;
  hugeint_t min_val;
  optional_idx dict_size;
  duckdb adds_nulls;
  element_type *in_stack_ffffffffffffff38;
  element_type *peVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  hugeint_t *local_b0;
  hugeint_t local_a8;
  Vector *local_98;
  idx_t local_90;
  hugeint_t *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  local_a8.lower = *(uint64_t *)pvVar11->data;
  local_a8.upper = *(uint64_t *)((long)pvVar11->data + 8);
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar2 = pvVar11->vector_type;
  local_b0 = &local_a8;
  if (VVar2 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    adds_nulls = SUB81(in_stack_ffffffffffffff38,0);
    puVar5 = (unsigned_long *)result->data;
    ldata = (hugeint_t *)pvVar11->data;
    FlatVector::VerifyFlatVector(pvVar11);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<duckdb::hugeint_t,unsigned_long,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t_const&)_1_>
              (ldata,puVar5,count,&pvVar11->validity,&result->validity,&local_b0,(bool)adds_nulls);
    return;
  }
  if (VVar2 != DICTIONARY_VECTOR) {
    if (VVar2 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar3 = (uint64_t *)result->data;
      pdVar4 = pvVar11->data;
      puVar5 = (pvVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      local_78.sel = *(SelectionVector **)pdVar4;
      local_78.data = *(data_ptr_t *)(pdVar4 + 8);
      hVar17 = hugeint_t::operator-((hugeint_t *)&local_78,&local_a8);
      *puVar3 = hVar17.lower;
      return;
    }
    goto LAB_013f067b;
  }
  DictionaryVector::VerifyDictionary(pvVar11);
  pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar11->buffer);
  local_78.sel = (SelectionVector *)pVVar12[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar16 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar16 * 2)) {
LAB_013f0671:
    bVar8 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(pvVar11);
    pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar11->auxiliary);
    if (*(char *)&pVVar12[1]._vptr_VectorBuffer != '\0') goto LAB_013f0671;
    local_98 = (Vector *)(pVVar12 + 1);
    puVar5 = (unsigned_long *)result->data;
    local_88 = (hugeint_t *)pVVar12[1].data.pointer;
    local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
    FlatVector::VerifyFlatVector(local_98);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<duckdb::hugeint_t,unsigned_long,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t_const&)_1_>
              (local_88,puVar5,local_90,(ValidityMask *)&pVVar12[1].data.allocated_size,
               &result->validity,&local_b0,(bool)SUB81(in_stack_ffffffffffffff38,0));
    DictionaryVector::VerifyDictionary(pvVar11);
    pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar11->buffer);
    iVar16 = optional_idx::GetIndex((optional_idx *)&local_78);
    Vector::Dictionary(result,result,iVar16,(SelectionVector *)(pVVar12 + 1),count);
    bVar8 = true;
  }
  if (bVar8) {
    return;
  }
LAB_013f067b:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(pvVar11,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar10 = local_78.sel;
  pdVar4 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      iVar16 = 0;
      do {
        hVar17 = hugeint_t::operator-((hugeint_t *)&stack0xffffffffffffff38,&local_a8);
        *(uint64_t *)(pdVar4 + iVar16 * 8) = hVar17.lower;
        iVar16 = iVar16 + 1;
      } while (count != iVar16);
    }
  }
  else if (count != 0) {
    p_Var6 = (allocate_function_ptr_t)pSVar10->sel_vector;
    uVar15 = 0;
    do {
      p_Var9 = p_Stack_c0;
      uVar13 = uVar15;
      if (p_Var6 != (allocate_function_ptr_t)0x0) {
        uVar13 = (ulong)*(uint *)(p_Var6 + uVar15 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar13 >> 6]
           >> (uVar13 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&stack0xffffffffffffff38,&local_80);
          peVar18 = (element_type *)0x0;
          p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = in_stack_ffffffffffffff38;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          in_stack_ffffffffffffff38 = peVar18;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            in_stack_ffffffffffffff38 = peVar18;
          }
          pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar14->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar7 = (byte)uVar15 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      else {
        in_stack_ffffffffffffff38 = *(element_type **)(local_78.data + uVar13 * 0x10);
        p_Stack_c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      (local_78.data + uVar13 * 0x10 + 8);
        hVar17 = hugeint_t::operator-((hugeint_t *)&stack0xffffffffffffff38,&local_a8);
        *(uint64_t *)(pdVar4 + uVar15 * 8) = hVar17.lower;
      }
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}